

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_close_notify(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  
  if ((ssl == (mbedtls_ssl_context *)0x0) || (ssl->conf == (mbedtls_ssl_config *)0x0)) {
    return -0x7100;
  }
  if (ssl->out_left == 0) {
    if (ssl->state == 0x10) {
      ssl->out_msgtype = 0x15;
      ssl->out_msglen = 2;
      *ssl->out_msg = '\x01';
      ssl->out_msg[1] = '\0';
      iVar4 = mbedtls_ssl_write_record(ssl);
      if (iVar4 != 0) {
        return iVar4;
      }
    }
    return 0;
  }
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    return -0x7100;
  }
  if (ssl->out_left == 0) {
    iVar4 = 0;
  }
  else {
    sVar5 = ssl->out_left;
    while (sVar5 != 0) {
      uVar3 = (*ssl->f_send)(ssl->p_bio,
                             ssl->out_hdr +
                             ((ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4)
                             - sVar5) + 5,sVar5);
      if ((int)uVar3 < 1) {
        return uVar3;
      }
      sVar5 = ssl->out_left - (ulong)uVar3;
      if (ssl->out_left < (ulong)uVar3) {
        return -0x6c00;
      }
      ssl->out_left = sVar5;
    }
    bVar2 = 8;
    do {
      puVar1 = ssl->out_ctr + ((ulong)bVar2 - 1);
      *puVar1 = *puVar1 + '\x01';
      if (*puVar1 != '\0') break;
      bVar2 = bVar2 - 1;
    } while ((*(uint *)&ssl->conf->field_0x174 & 2) < (uint)bVar2);
    iVar4 = -0x6b80;
    if ((*(uint *)&ssl->conf->field_0x174 & 2) != (uint)bVar2) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_ssl_close_notify( mbedtls_ssl_context *ssl )
{
    int ret;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write close notify" ) );

    if( ssl->out_left != 0 )
        return( mbedtls_ssl_flush_output( ssl ) );

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_WARNING,
                        MBEDTLS_SSL_ALERT_MSG_CLOSE_NOTIFY ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_send_alert_message", ret );
            return( ret );
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write close notify" ) );

    return( 0 );
}